

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycling_allocator.hpp
# Opt level: O2

void __thiscall
asio::detail::
recycling_allocator<asio::detail::executor_function::impl<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>,_asio::detail::thread_info_base::executor_function_tag>
::deallocate(recycling_allocator<asio::detail::executor_function::impl<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>,_asio::detail::thread_info_base::executor_function_tag>
             *this,impl<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
                   *p,size_t n)

{
  undefined8 uVar1;
  long *in_FS_OFFSET;
  
  if (*(long *)(*in_FS_OFFSET + -0x13d8) == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x13d8) + 8);
  }
  thread_info_base::deallocate<asio::detail::thread_info_base::executor_function_tag>
            (uVar1,p,n << 6);
  return;
}

Assistant:

void deallocate(T* p, std::size_t n)
  {
#if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    thread_info_base::deallocate(Purpose(),
        thread_context::top_of_thread_call_stack(), p, sizeof(T) * n);
#else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    (void)n;
    asio::aligned_delete(p);
#endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
  }